

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O2

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  byte bVar1;
  undefined2 uVar2;
  ushort uVar3;
  size_t sVar4;
  ushort uVar5;
  byte bVar6;
  ENetChannel *pEVar7;
  
  pEVar7 = peer->channels + (outgoingCommand->command).header.channelID;
  sVar4 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar4 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    uVar5 = (short)*(undefined4 *)&peer->outgoingReliableSequenceNumber + 1;
    peer->outgoingReliableSequenceNumber = uVar5;
LAB_00104421:
    uVar3 = 0;
  }
  else {
    bVar1 = (outgoingCommand->command).header.command;
    if ((char)bVar1 < '\0') {
      uVar2 = pEVar7->outgoingReliableSequenceNumber;
      uVar5 = uVar2 + 1;
      pEVar7->outgoingReliableSequenceNumber = uVar5;
      pEVar7->outgoingUnreliableSequenceNumber = 0;
      goto LAB_00104421;
    }
    if (0x3f < bVar1) {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      uVar5 = 0;
      goto LAB_00104421;
    }
    uVar3 = pEVar7->outgoingUnreliableSequenceNumber;
    if (outgoingCommand->fragmentOffset == 0) {
      uVar3 = uVar3 + 1;
      pEVar7->outgoingUnreliableSequenceNumber = uVar3;
    }
    uVar5 = pEVar7->outgoingReliableSequenceNumber;
  }
  outgoingCommand->reliableSequenceNumber = uVar5;
  outgoingCommand->unreliableSequenceNumber = uVar3;
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  (outgoingCommand->command).header.reliableSequenceNumber = uVar5 << 8 | uVar5 >> 8;
  bVar1 = (outgoingCommand->command).header.command;
  bVar6 = bVar1 & 0xf;
  if (bVar6 != 7) {
    if (bVar6 != 9) goto LAB_00104464;
    uVar3 = peer->outgoingUnsequencedGroup;
  }
  (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar3 << 8 | uVar3 >> 8;
LAB_00104464:
  enet_list_insert((ENetListIterator)
                   (peer->unsequencedWindow + (ulong)(-1 < (char)bVar1) * 4 + -0xe),outgoingCommand)
  ;
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
      enet_list_insert (enet_list_end (& peer -> outgoingReliableCommands), outgoingCommand);
    else
      enet_list_insert (enet_list_end (& peer -> outgoingUnreliableCommands), outgoingCommand);
}